

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::hugeint_t,long,duckdb::ArgMinMaxState<duckdb::hugeint_t,long>>
               (ArgMinMaxState<duckdb::hugeint_t,_long> *state,hugeint_t x_data,long y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  long *in_RCX;
  ArgMinMaxState<duckdb::hugeint_t,_long> *in_RSI;
  hugeint_t *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  long *in_stack_ffffffffffffffc8;
  long *in_stack_ffffffffffffffd0;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_stack_ffffffffffffffd0);
  if ((bVar1) &&
     (bVar1 = LessThan::Operation<long>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), bVar1)
     ) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_RDI);
    Assign<duckdb::hugeint_t,long,duckdb::ArgMinMaxState<duckdb::hugeint_t,long>>
              (in_RSI,in_RDI,in_RCX,SUB81((ulong)in_R8 >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}